

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O1

FilterPushdownResult __thiscall
duckdb::FilterCombiner::TryPushdownOrClause
          (FilterCombiner *this,TableFilterSet *table_filters,
          vector<duckdb::ColumnIndex,_true> *column_ids,Expression *expr)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> _Var1;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> _Var2;
  optional_ptr<duckdb::BoundConstantExpression,_true> oVar3;
  TableFilterSet *this_01;
  ExpressionType type;
  BoundConjunctionExpression *pBVar4;
  TableFilter *this_02;
  reference this_03;
  pointer pEVar5;
  BoundComparisonExpression *pBVar6;
  const_reference pvVar7;
  _Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_> _Var8;
  pointer pCVar9;
  OptionalFilter *this_04;
  pointer pOVar10;
  pointer *__ptr;
  size_type __n;
  FilterPushdownResult FVar11;
  bool bVar12;
  bool bVar13;
  templated_unique_single_t optional_filter;
  templated_unique_single_t conj_filter;
  optional_ptr<duckdb::BoundConstantExpression,_true> const_val;
  _Head_base<0UL,_duckdb::OptionalFilter_*,_false> local_b8;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_b0;
  _Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_> local_a8;
  optional_ptr<duckdb::BoundConstantExpression,_true> local_a0;
  _Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_> local_98;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_90;
  vector<duckdb::ColumnIndex,_true> *local_88;
  undefined1 local_80 [64];
  TableFilterSet *local_40;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_38;
  
  FVar11 = NO_PUSHDOWN;
  if (((expr->super_BaseExpression).expression_class == BOUND_CONJUNCTION) &&
     (pBVar4 = BaseExpression::Cast<duckdb::BoundConjunctionExpression>(&expr->super_BaseExpression)
     , FVar11 = NO_PUSHDOWN, (pBVar4->super_Expression).super_BaseExpression.type == CONJUNCTION_OR)
     ) {
    this_02 = (TableFilter *)operator_new(0x28);
    ConjunctionOrFilter::ConjunctionOrFilter((ConjunctionOrFilter *)this_02);
    local_b0._M_head_impl = this_02;
    if ((pBVar4->children).
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pBVar4->children).
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      FVar11 = NO_PUSHDOWN;
    }
    else {
      bVar13 = (pBVar4->children).
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish ==
               (pBVar4->children).
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar12 = !bVar13;
      local_40 = table_filters;
      if (bVar13) {
        local_98.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl =
             (_Head_base<0UL,_duckdb::TableFilter_*,_false>)(TableFilter *)0x0;
      }
      else {
        local_38 = &pBVar4->children;
        local_98.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl =
             (_Head_base<0UL,_duckdb::TableFilter_*,_false>)(TableFilter *)0x0;
        __n = 0;
        local_88 = column_ids;
        do {
          this_03 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[](local_38,__n);
          pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(this_03);
          if ((pEVar5->super_BaseExpression).expression_class == BOUND_COMPARISON) {
            local_b8._M_head_impl = (OptionalFilter *)0x0;
            local_a0.ptr = (BoundConstantExpression *)0x0;
            pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->(this_03);
            pBVar6 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                               (&pEVar5->super_BaseExpression);
            this_00 = &pBVar6->left;
            pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->(this_00);
            if ((pEVar5->super_BaseExpression).expression_class != BOUND_COLUMN_REF) {
LAB_00d5cc2f:
              pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       ::operator->(this_00);
              if ((pEVar5->super_BaseExpression).expression_class == BOUND_CONSTANT) {
                pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         ::operator->(&pBVar6->right);
                if ((pEVar5->super_BaseExpression).expression_class == BOUND_COLUMN_REF) {
                  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           ::operator->(&pBVar6->right);
                  local_b8._M_head_impl =
                       (OptionalFilter *)
                       BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                                 (&pEVar5->super_BaseExpression);
                  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           ::operator->(this_00);
                  local_a0.ptr = BaseExpression::Cast<duckdb::BoundConstantExpression>
                                           (&pEVar5->super_BaseExpression);
                  bVar13 = true;
                  goto LAB_00d5cc76;
                }
              }
              goto LAB_00d5cca4;
            }
            pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->(&pBVar6->right);
            if ((pEVar5->super_BaseExpression).expression_class != BOUND_CONSTANT)
            goto LAB_00d5cc2f;
            pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->(this_00);
            local_b8._M_head_impl =
                 (OptionalFilter *)
                 BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                           (&pEVar5->super_BaseExpression);
            pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->(&pBVar6->right);
            local_a0.ptr = BaseExpression::Cast<duckdb::BoundConstantExpression>
                                     (&pEVar5->super_BaseExpression);
            bVar13 = false;
LAB_00d5cc76:
            if (__n == 0) {
              optional_ptr<duckdb::BoundColumnRefExpression,_true>::CheckValid
                        ((optional_ptr<duckdb::BoundColumnRefExpression,_true> *)&local_b8);
              pvVar7 = vector<duckdb::ColumnIndex,_true>::operator[]
                                 (local_88,(size_type)
                                           local_b8._M_head_impl[4].super_TableFilter.
                                           _vptr_TableFilter);
              local_98.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl =
                   (_Head_base<0UL,_duckdb::TableFilter_*,_false>)pvVar7->index;
            }
            else {
              optional_ptr<duckdb::BoundColumnRefExpression,_true>::CheckValid
                        ((optional_ptr<duckdb::BoundColumnRefExpression,_true> *)&local_b8);
              pvVar7 = vector<duckdb::ColumnIndex,_true>::operator[]
                                 (local_88,(size_type)
                                           local_b8._M_head_impl[4].super_TableFilter.
                                           _vptr_TableFilter);
              if (local_98.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl !=
                  (TableFilter *)pvVar7->index) goto LAB_00d5cca4;
            }
            type = (pBVar6->super_Expression).super_BaseExpression.type;
            if (bVar13) {
              type = FlipComparisonExpression(type);
            }
            optional_ptr<duckdb::BoundConstantExpression,_true>::CheckValid(&local_a0);
            if (((local_a0.ptr)->value).is_null == true) {
              bVar13 = true;
              if (type == COMPARE_DISTINCT_FROM) {
                _Var8.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl =
                     (_Head_base<0UL,_duckdb::TableFilter_*,_false>)operator_new(0x10);
                IsNotNullFilter::IsNotNullFilter
                          ((IsNotNullFilter *)
                           _Var8.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl);
                pCVar9 = unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                         ::operator->((unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                                       *)&local_b0);
                local_80._0_8_ =
                     _Var8.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
                ::std::
                vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                          ((vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
                            *)&(pCVar9->super_ConjunctionFilter).child_filters,
                           (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                            *)local_80);
              }
              else {
                if (type != COMPARE_BOUNDARY_END) goto LAB_00d5cca7;
                _Var8.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl =
                     (_Head_base<0UL,_duckdb::TableFilter_*,_false>)operator_new(0x10);
                IsNullFilter::IsNullFilter
                          ((IsNullFilter *)
                           _Var8.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl);
                pCVar9 = unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                         ::operator->((unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                                       *)&local_b0);
                local_80._0_8_ =
                     _Var8.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
                ::std::
                vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                          ((vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
                            *)&(pCVar9->super_ConjunctionFilter).child_filters,
                           (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                            *)local_80);
              }
              if ((_Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
                   )local_80._0_8_ != (TableFilter *)0x0) {
                (**(code **)(*(long *)local_80._0_8_ + 8))();
              }
            }
            else {
              optional_ptr<duckdb::BoundConstantExpression,_true>::CheckValid(&local_a0);
              oVar3.ptr = local_a0.ptr;
              local_a8.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl =
                   (_Head_base<0UL,_duckdb::TableFilter_*,_false>)operator_new(0x50);
              Value::Value((Value *)local_80,&(oVar3.ptr)->value);
              _Var8.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl =
                   local_a8.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
              ConstantFilter::ConstantFilter
                        ((ConstantFilter *)
                         local_a8.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl,
                         type,(Value *)local_80);
              Value::~Value((Value *)local_80);
              pCVar9 = unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                       ::operator->((unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                                     *)&local_b0);
              local_80._0_8_ =
                   _Var8.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
              ::std::
              vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
                          *)&(pCVar9->super_ConjunctionFilter).child_filters,
                         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                          *)local_80);
              if ((_Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
                   )local_80._0_8_ != (TableFilter *)0x0) {
                (**(code **)(*(long *)local_80._0_8_ + 8))();
              }
              bVar13 = true;
            }
          }
          else {
LAB_00d5cca4:
            bVar13 = false;
          }
LAB_00d5cca7:
          if (!bVar13) break;
          __n = __n + 1;
          bVar12 = __n < (ulong)((long)(pBVar4->children).
                                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                       .
                                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pBVar4->children).
                                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                       .
                                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3);
        } while (bVar12);
      }
      FVar11 = NO_PUSHDOWN;
      if (!bVar12) {
        this_04 = (OptionalFilter *)operator_new(0x18);
        local_80._0_8_ =
             (__uniq_ptr_data<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true,_true>
              )0x0;
        OptionalFilter::OptionalFilter
                  (this_04,(unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                            *)local_80);
        this_01 = local_40;
        local_b8._M_head_impl = this_04;
        if ((TableFilter *)local_80._0_8_ != (TableFilter *)0x0) {
          (*(*(_func_int ***)local_80._0_8_)[1])();
        }
        _Var2._M_head_impl = local_b0._M_head_impl;
        local_b0._M_head_impl = (TableFilter *)0x0;
        pOVar10 = unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true>
                  ::operator->((unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true>
                                *)&local_b8);
        _Var1._M_head_impl =
             (pOVar10->child_filter).
             super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
             super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
             .super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
        (pOVar10->child_filter).
        super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
        super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
        super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl = _Var2._M_head_impl;
        if (_Var1._M_head_impl != (TableFilter *)0x0) {
          (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableFilter + 8))();
        }
        local_90._M_head_impl = &(local_b8._M_head_impl)->super_TableFilter;
        local_80._0_8_ = local_98.super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
        local_80._8_8_ = (element_type *)0x0;
        local_80._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_80._24_8_ = (pointer)0x0;
        local_b8._M_head_impl = (OptionalFilter *)0x0;
        TableFilterSet::PushFilter
                  (this_01,(ColumnIndex *)local_80,
                   (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)&local_90);
        if ((OptionalFilter *)local_90._M_head_impl != (OptionalFilter *)0x0) {
          (*((TableFilter *)&(local_90._M_head_impl)->_vptr_TableFilter)->_vptr_TableFilter[1])();
        }
        local_90._M_head_impl = (TableFilter *)0x0;
        ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                  ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)
                   (local_80 + 8));
        if ((BoundColumnRefExpression *)local_b8._M_head_impl != (BoundColumnRefExpression *)0x0) {
          (*(((Expression *)&(local_b8._M_head_impl)->super_TableFilter)->super_BaseExpression).
            _vptr_BaseExpression[1])();
        }
        FVar11 = PUSHED_DOWN_PARTIALLY;
      }
    }
    if (local_b0._M_head_impl != (TableFilter *)0x0) {
      (*(((ConjunctionFilter *)&(local_b0._M_head_impl)->_vptr_TableFilter)->super_TableFilter).
        _vptr_TableFilter[1])();
    }
  }
  return FVar11;
}

Assistant:

FilterPushdownResult FilterCombiner::TryPushdownOrClause(TableFilterSet &table_filters,
                                                         const vector<ColumnIndex> &column_ids, Expression &expr) {
	if (expr.GetExpressionClass() != ExpressionClass::BOUND_CONJUNCTION) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &conj = expr.Cast<BoundConjunctionExpression>();
	if (conj.GetExpressionType() != ExpressionType::CONJUNCTION_OR) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto conj_filter = make_uniq<ConjunctionOrFilter>();
	if (conj.children.empty()) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	idx_t column_id = 0;
	for (idx_t i = 0; i < conj.children.size(); i++) {
		auto &child = conj.children[i];
		if (child->GetExpressionClass() != ExpressionClass::BOUND_COMPARISON) {
			return FilterPushdownResult::NO_PUSHDOWN;
		}
		optional_ptr<BoundColumnRefExpression> column_ref;
		optional_ptr<BoundConstantExpression> const_val;
		auto &comp = child->Cast<BoundComparisonExpression>();
		bool invert = false;
		if (comp.left->GetExpressionClass() == ExpressionClass::BOUND_COLUMN_REF &&
		    comp.right->GetExpressionClass() == ExpressionClass::BOUND_CONSTANT) {
			column_ref = comp.left->Cast<BoundColumnRefExpression>();
			const_val = comp.right->Cast<BoundConstantExpression>();
		} else if (comp.left->GetExpressionClass() == ExpressionClass::BOUND_CONSTANT &&
		           comp.right->GetExpressionClass() == ExpressionClass::BOUND_COLUMN_REF) {
			column_ref = comp.right->Cast<BoundColumnRefExpression>();
			const_val = comp.left->Cast<BoundConstantExpression>();
			invert = true;
		} else {
			// child of OR filter is not simple so we do not push the or filter down at all
			return FilterPushdownResult::NO_PUSHDOWN;
		}

		if (i == 0) {
			auto &col_id = column_ids[column_ref->binding.column_index];
			column_id = col_id.GetPrimaryIndex();
		} else if (column_id != column_ids[column_ref->binding.column_index].GetPrimaryIndex()) {
			return FilterPushdownResult::NO_PUSHDOWN;
		}

		auto comparison_type = invert ? FlipComparisonExpression(comp.GetExpressionType()) : comp.GetExpressionType();
		if (const_val->value.IsNull()) {
			switch (comparison_type) {
			case ExpressionType::COMPARE_DISTINCT_FROM: {
				auto null_filter = make_uniq<IsNotNullFilter>();
				conj_filter->child_filters.push_back(std::move(null_filter));
				break;
			}
			case ExpressionType::COMPARE_NOT_DISTINCT_FROM: {
				auto null_filter = make_uniq<IsNullFilter>();
				conj_filter->child_filters.push_back(std::move(null_filter));
				break;
			}
			default:
				// if any other comparison type (i.e EQUAL, NOT_EQUAL) do not push a table filter - this is a nop
				// since x = NULL is always falsey, and this is a chain of OR conditions, we can just ignore it
				break;
			}
		} else {
			auto const_filter = make_uniq<ConstantFilter>(comparison_type, const_val->value);
			conj_filter->child_filters.push_back(std::move(const_filter));
		}
	}
	auto optional_filter = make_uniq<OptionalFilter>();
	optional_filter->child_filter = std::move(conj_filter);
	table_filters.PushFilter(ColumnIndex(column_id), std::move(optional_filter));
	return FilterPushdownResult::PUSHED_DOWN_PARTIALLY;
}